

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSourceState::PrepareBuild
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
  *this_00;
  ClientContext *pCVar1;
  bool bVar2;
  uint uVar3;
  type this_01;
  pointer pTVar4;
  idx_t iVar5;
  type this_02;
  idx_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  
  this_01 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
            operator*(&sink->hash_table);
  this_00 = &sink->temporary_memory_state;
  pTVar4 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  pCVar1 = sink->context;
  iVar5 = JoinHashTable::GetRemainingSize(this_01);
  TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
            (pTVar4,pCVar1,iVar5 + sink->probe_side_requirement);
  if (sink->external == true) {
    do {
      pTVar4 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      iVar5 = TemporaryMemoryState::GetReservation(pTVar4);
      bVar2 = JoinHashTable::PrepareExternalFinalize(this_01,iVar5 - sink->probe_side_requirement);
      if (!bVar2) break;
      this_02 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator*(&this_01->data_collection);
      piVar6 = TupleDataCollection::Count(this_02);
      if (((*piVar6 != 0) ||
          (uVar3 = (uint)(byte)(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                               super_CachingPhysicalOperator.field_0x81, 10 < uVar3)) ||
         ((0x62cU >> (uVar3 & 0x1f) & 1) == 0)) {
        this->build_chunk_idx = 0;
        iVar5 = TupleDataCollection::ChunkCount(this_02);
        this->build_chunk_count = iVar5;
        this->build_chunk_done = 0;
        uVar8 = 1;
        if ((sink->context->config).verify_parallelism == false) {
          bVar2 = KeysAreSkewed(sink);
          uVar8 = this->build_chunk_count;
          if (!bVar2) {
            uVar7 = 0x40;
            if (uVar8 < 0x40) {
              uVar7 = uVar8;
            }
            uVar8 = uVar7 + (uVar7 == 0);
          }
        }
        this->build_chunks_per_thread = uVar8;
        JoinHashTable::AllocatePointerTable(this_01);
        JoinHashTable::InitializePointerTable(this_01,0,this_01->capacity);
        LOCK();
        (this->global_stage)._M_i = BUILD;
        UNLOCK();
        return;
      }
      this_01 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator*(&sink->hash_table);
      pTVar4 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      pCVar1 = sink->context;
      iVar5 = JoinHashTable::GetRemainingSize(this_01);
      TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
                (pTVar4,pCVar1,iVar5 + sink->probe_side_requirement);
    } while (sink->external != false);
  }
  LOCK();
  (this->global_stage)._M_i = DONE;
  UNLOCK();
  pTVar4 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  TemporaryMemoryState::SetZero(pTVar4);
  return;
}

Assistant:

void HashJoinGlobalSourceState::PrepareBuild(HashJoinGlobalSinkState &sink) {
	D_ASSERT(global_stage != HashJoinSourceStage::BUILD);
	auto &ht = *sink.hash_table;

	// Update remaining size
	sink.temporary_memory_state->SetRemainingSizeAndUpdateReservation(sink.context, ht.GetRemainingSize() +
	                                                                                    sink.probe_side_requirement);

	// Try to put the next partitions in the block collection of the HT
	D_ASSERT(!sink.external || sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
	if (!sink.external ||
	    !ht.PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() - sink.probe_side_requirement)) {
		global_stage = HashJoinSourceStage::DONE;
		sink.temporary_memory_state->SetZero();
		return;
	}

	auto &data_collection = ht.GetDataCollection();
	if (data_collection.Count() == 0 && op.EmptyResultIfRHSIsEmpty()) {
		PrepareBuild(sink);
		return;
	}

	build_chunk_idx = 0;
	build_chunk_count = data_collection.ChunkCount();
	build_chunk_done = 0;

	if (sink.context.config.verify_parallelism) {
		build_chunks_per_thread = 1;
	} else {
		if (KeysAreSkewed(sink)) {
			build_chunks_per_thread = build_chunk_count; // This forces single-threaded building
		} else {
			build_chunks_per_thread = // Same task size as in HashJoinFinalizeEvent
			    MaxValue<idx_t>(MinValue(build_chunk_count, HashJoinFinalizeEvent::CHUNKS_PER_TASK), 1);
		}
	}

	ht.AllocatePointerTable();
	ht.InitializePointerTable(0, ht.capacity);

	global_stage = HashJoinSourceStage::BUILD;
}